

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O2

string * __thiscall
cmCPackGenerator::GetComponentPackageFileName
          (string *__return_storage_ptr__,cmCPackGenerator *this,string *initialPackageFileName,
          string *groupOrComponentName,bool isGroupName)

{
  bool bVar1;
  char *pcVar2;
  string groupDispVar;
  string suffix;
  string dispNameVar;
  allocator local_c9;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::operator+(&local_68,"-",groupOrComponentName);
  std::operator+(&local_88,"CPACK_",&this->Name);
  std::operator+(&local_48,&local_88,"_USE_DISPLAY_NAME_IN_FILENAME");
  std::__cxx11::string::~string((string *)&local_88);
  bVar1 = IsOn(this,&local_48);
  if (!bVar1) goto LAB_0027e676;
  if (isGroupName) {
    cmsys::SystemTools::UpperCase(&local_c8,groupOrComponentName);
    std::operator+(&local_a8,"CPACK_COMPONENT_GROUP_",&local_c8);
    std::operator+(&local_88,&local_a8,"_DISPLAY_NAME");
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    pcVar2 = GetOption(this,&local_88);
    if (pcVar2 != (char *)0x0) {
      std::__cxx11::string::string((string *)&local_c8,pcVar2,&local_c9);
      std::operator+(&local_a8,"-",&local_c8);
LAB_0027e648:
      std::__cxx11::string::operator=((string *)&local_68,(string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
    }
  }
  else {
    cmsys::SystemTools::UpperCase(&local_c8,groupOrComponentName);
    std::operator+(&local_a8,"CPACK_COMPONENT_",&local_c8);
    std::operator+(&local_88,&local_a8,"_DISPLAY_NAME");
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    pcVar2 = GetOption(this,&local_88);
    if (pcVar2 != (char *)0x0) {
      std::__cxx11::string::string((string *)&local_c8,pcVar2,&local_c9);
      std::operator+(&local_a8,"-",&local_c8);
      goto LAB_0027e648;
    }
  }
  std::__cxx11::string::~string((string *)&local_88);
LAB_0027e676:
  std::operator+(__return_storage_ptr__,initialPackageFileName,&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackGenerator::GetComponentPackageFileName(
    const std::string& initialPackageFileName,
    const std::string& groupOrComponentName,
    bool isGroupName) {

  /*
   * the default behavior is to use the
   * component [group] name as a suffix
   */
  std::string suffix="-"+groupOrComponentName;
  /* check if we should use DISPLAY name */
  std::string dispNameVar = "CPACK_"+Name+"_USE_DISPLAY_NAME_IN_FILENAME";
  if (IsOn(dispNameVar))
    {
    /* the component Group case */
    if (isGroupName)
      {
      std::string groupDispVar = "CPACK_COMPONENT_GROUP_"
          + cmSystemTools::UpperCase(groupOrComponentName) + "_DISPLAY_NAME";
      const char* groupDispName = GetOption(groupDispVar);
      if (groupDispName)
        {
        suffix = "-"+std::string(groupDispName);
        }
      }
    /* the [single] component case */
    else
      {
      std::string dispVar = "CPACK_COMPONENT_"
           + cmSystemTools::UpperCase(groupOrComponentName) + "_DISPLAY_NAME";
            const char* dispName = GetOption(dispVar);
            if(dispName)
              {
              suffix = "-"+std::string(dispName);
              }
            }
      }
  return initialPackageFileName + suffix;
}